

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

void __thiscall Gecko::Graph::update(Graph *this,Index i,Index j,Float w,Float b)

{
  uint uVar1;
  uint uVar2;
  pointer pNVar3;
  pointer pfVar4;
  ulong uVar5;
  int iVar6;
  
  pNVar3 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pNVar3[i - 1].arc;
  uVar5 = (ulong)uVar1;
  uVar2 = pNVar3[i].arc;
  if (uVar1 < uVar2) {
    iVar6 = uVar2 - uVar1;
    do {
      if ((this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] == j) {
        if (uVar5 != 0) {
          pfVar4 = (this->weight).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar5 = uVar5 & 0xffffffff;
          pfVar4[uVar5] = w + pfVar4[uVar5];
          pfVar4 = (this->bond).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar4[uVar5] = b + pfVar4[uVar5];
          return;
        }
        break;
      }
      uVar5 = uVar5 + 1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  insert_arc(this,i,j,w,b);
  return;
}

Assistant:

Arc::Index node_begin(Node::Index i) const { return node[i - 1].arc; }